

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMU_SCHEME_KEYEDHASH_Marshal
                 (TPMU_SCHEME_KEYEDHASH *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_SCHEME_KEYEDHASH *source_local;
  
  if (selector == 5) {
    source_local._6_2_ = UINT16_Marshal(&(source->hmac).hashAlg,buffer,size);
  }
  else if (selector == 10) {
    source_local._6_2_ = TPMS_SCHEME_XOR_Marshal(&source->alg_xor,buffer,size);
  }
  else if (selector == 0x10) {
    source_local._6_2_ = 0;
  }
  else {
    source_local._6_2_ = 0;
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPMU_SCHEME_KEYEDHASH_Marshal(TPMU_SCHEME_KEYEDHASH *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_HMAC
        case TPM_ALG_HMAC:
            return TPMS_SCHEME_HMAC_Marshal((TPMS_SCHEME_HMAC *)&(source->hmac), buffer, size);
#endif // ALG_HMAC
#if         ALG_XOR
        case TPM_ALG_XOR:
            return TPMS_SCHEME_XOR_Marshal((TPMS_SCHEME_XOR *)&(source->alg_xor), buffer, size);
#endif // ALG_XOR
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}